

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

int Saig_StrSimDetectUnique(Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  int iVar2;
  Aig_Type_t AVar3;
  Aig_Type_t AVar4;
  Aig_Obj_t **ppTable_00;
  Aig_Obj_t **ppNexts_00;
  Aig_Obj_t **ppNexts_01;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  int local_4c;
  int Counter;
  int nTableSize;
  int i;
  Aig_Obj_t *pEntry;
  Aig_Obj_t *pObj;
  Aig_Obj_t **ppCands;
  Aig_Obj_t **ppNexts;
  Aig_Obj_t **ppTable;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  iVar1 = Aig_ManObjNum(p0);
  iVar1 = Abc_PrimeCudd(iVar1 / 2);
  ppTable_00 = (Aig_Obj_t **)calloc((long)iVar1,8);
  iVar2 = Aig_ManObjNumMax(p0);
  ppNexts_00 = (Aig_Obj_t **)calloc((long)iVar2,8);
  iVar2 = Aig_ManObjNumMax(p0);
  ppNexts_01 = (Aig_Obj_t **)calloc((long)iVar2,8);
  for (Counter = 0; iVar2 = Vec_PtrSize(p0->vObjs), Counter < iVar2; Counter = Counter + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,Counter);
    if (((pAVar5 != (Aig_Obj_t *)0x0) &&
        (((iVar2 = Aig_ObjIsCi(pAVar5), iVar2 != 0 || (iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0))
         && (pAVar6 = Aig_ObjRepr(p0,pAVar5), pAVar6 == (Aig_Obj_t *)0x0)))) &&
       ((iVar2 = Saig_StrSimIsZero(pAVar5), iVar2 == 0 &&
        (iVar2 = Saig_StrSimIsOne(pAVar5), iVar2 == 0)))) {
      pAVar6 = Saig_StrSimTableLookup(ppTable_00,ppNexts_00,iVar1,pAVar5);
      if (pAVar6 == (Aig_Obj_t *)0x0) {
        Saig_StrSimTableInsert(ppTable_00,ppNexts_00,iVar1,pAVar5);
      }
      else {
        *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffef | 0x10;
      }
    }
  }
  for (Counter = 0; iVar2 = Vec_PtrSize(p1->vObjs), Counter < iVar2; Counter = Counter + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p1->vObjs,Counter);
    if (((pAVar5 != (Aig_Obj_t *)0x0) &&
        ((((iVar2 = Aig_ObjIsCi(pAVar5), iVar2 != 0 || (iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0))
          && (pAVar6 = Aig_ObjRepr(p1,pAVar5), pAVar6 == (Aig_Obj_t *)0x0)) &&
         ((iVar2 = Saig_StrSimIsZero(pAVar5), iVar2 == 0 &&
          (iVar2 = Saig_StrSimIsOne(pAVar5), iVar2 == 0)))))) &&
       (pAVar6 = Saig_StrSimTableLookup(ppTable_00,ppNexts_00,iVar1,pAVar5),
       pAVar6 != (Aig_Obj_t *)0x0)) {
      pAVar7 = Saig_ObjNext(ppNexts_01,pAVar6);
      if (pAVar7 == (Aig_Obj_t *)0x0) {
        Saig_ObjSetNext(ppNexts_01,pAVar6,pAVar5);
      }
      else {
        *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffef | 0x10;
      }
    }
  }
  local_4c = 0;
  for (Counter = 0; Counter < iVar1; Counter = Counter + 1) {
    for (_nTableSize = ppTable_00[Counter]; _nTableSize != (Aig_Obj_t *)0x0;
        _nTableSize = Saig_ObjNext(ppNexts_00,_nTableSize)) {
      if (((*(ulong *)&_nTableSize->field_0x18 >> 4 & 1) == 0) &&
         (pAVar5 = Saig_ObjNext(ppNexts_01,_nTableSize), pAVar5 != (Aig_Obj_t *)0x0)) {
        AVar3 = Aig_ObjType(_nTableSize);
        AVar4 = Aig_ObjType(pAVar5);
        if (AVar3 == AVar4) {
          Aig_ObjSetRepr(p0,_nTableSize,pAVar5);
          Aig_ObjSetRepr(p1,pAVar5,_nTableSize);
          local_4c = local_4c + 1;
        }
      }
    }
  }
  Aig_ManCleanMarkA(p0);
  if (ppTable_00 != (Aig_Obj_t **)0x0) {
    free(ppTable_00);
  }
  if (ppNexts_00 != (Aig_Obj_t **)0x0) {
    free(ppNexts_00);
  }
  if (ppNexts_01 != (Aig_Obj_t **)0x0) {
    free(ppNexts_01);
  }
  return local_4c;
}

Assistant:

int Saig_StrSimDetectUnique( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t ** ppTable, ** ppNexts, ** ppCands;
    Aig_Obj_t * pObj, * pEntry;
    int i, nTableSize, Counter;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Aig_ManObjNum(p0)/2 );
    ppTable = ABC_CALLOC( Aig_Obj_t *, nTableSize );
    ppNexts = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p0) );
    ppCands = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p0) );

    // hash nodes of the first AIG
    Aig_ManForEachObj( p0, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( Aig_ObjRepr(p0, pObj) )
            continue;
        if ( Saig_StrSimIsZero(pObj) || Saig_StrSimIsOne(pObj) )
            continue;
        // check if the entry exists
        pEntry = Saig_StrSimTableLookup( ppTable, ppNexts, nTableSize, pObj );
        if ( pEntry == NULL ) // insert
            Saig_StrSimTableInsert( ppTable, ppNexts, nTableSize, pObj );
        else // mark the entry as not unique
            pEntry->fMarkA = 1;
    }

    // hash nodes from the second AIG
    Aig_ManForEachObj( p1, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( Aig_ObjRepr(p1, pObj) )
            continue;
        if ( Saig_StrSimIsZero(pObj) || Saig_StrSimIsOne(pObj) )
            continue;
        // check if the entry exists
        pEntry = Saig_StrSimTableLookup( ppTable, ppNexts, nTableSize, pObj );
        if ( pEntry == NULL ) // skip
            continue;
        // if there is no candidate, label it
        if ( Saig_ObjNext( ppCands, pEntry ) == NULL )
            Saig_ObjSetNext( ppCands, pEntry, pObj );
        else // mark the entry as not unique
            pEntry->fMarkA = 1;
    }

    // create representatives for the unique entries
    Counter = 0;
    for ( i = 0; i < nTableSize; i++ )
        for ( pEntry = ppTable[i]; pEntry; pEntry = Saig_ObjNext(ppNexts,pEntry) )
            if ( !pEntry->fMarkA && (pObj = Saig_ObjNext( ppCands, pEntry )) )
            {
//                assert( Aig_ObjIsNode(pEntry) == Aig_ObjIsNode(pObj) );
                if ( Aig_ObjType(pEntry) != Aig_ObjType(pObj) )
                    continue;
                Aig_ObjSetRepr( p0, pEntry, pObj );
                Aig_ObjSetRepr( p1, pObj, pEntry );
                Counter++;
            }

    // cleanup
    Aig_ManCleanMarkA( p0 );
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    ABC_FREE( ppCands );
    return Counter;
}